

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O2

void __thiscall QGroupBox::mousePressEvent(QGroupBox *this,QMouseEvent *event)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  QRect local_d0;
  QPoint local_c0;
  QStyleOptionGroupBox box;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(event + 0x40) == 1) {
    lVar2 = *(long *)&(this->super_QWidget).field_0x8;
    memset(&box,0xaa,0x88);
    QStyleOptionGroupBox::QStyleOptionGroupBox(&box);
    (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&box);
    pQVar4 = QWidget::style(&this->super_QWidget);
    local_d0 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)event);
    local_c0 = QPointF::toPoint((QPointF *)&local_d0);
    uVar3 = (**(code **)(*(long *)pQVar4 + 0xd0))(pQVar4,7,&box,&local_c0,this);
    *(uint *)(lVar2 + 0x280) = uVar3;
    if (((uVar3 & 3) == 0) || (*(char *)(lVar2 + 0x279) == '\0')) {
      event[0xc] = (QMouseEvent)0x0;
    }
    else {
      *(undefined1 *)(lVar2 + 0x27c) = 1;
      pQVar4 = QWidget::style(&this->super_QWidget);
      local_d0 = (QRect)(**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,7,&box,1,this);
      QWidget::update(&this->super_QWidget,&local_d0);
    }
    QStyleOptionGroupBox::~QStyleOptionGroupBox(&box);
  }
  else {
    event[0xc] = (QMouseEvent)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::mousePressEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }

    Q_D(QGroupBox);
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    d->pressedControl = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                       event->position().toPoint(), this);
    if (d->checkable && (d->pressedControl & (QStyle::SC_GroupBoxCheckBox | QStyle::SC_GroupBoxLabel))) {
        d->overCheckBox = true;
        update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));
    } else {
        event->ignore();
    }
}